

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_kvs_close(fdb_kvs_handle *handle)

{
  kvs_info *pkVar1;
  fdb_status fVar2;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar2 = FDB_RESULT_KV_STORE_BUSY;
    if (handle->num_iterators == 0) {
      if ((handle->shandle == (snap_handle *)0x0) || (handle->kvs != (kvs_info *)0x0)) {
        pkVar1 = handle->kvs;
        if ((pkVar1 == (kvs_info *)0x0) || (pkVar1->type == '\0')) {
          if (handle->fhandle->root == handle) {
            fdb_assert_die("handle->fhandle->root != handle",
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,0x78e,(uint64_t)handle,0);
          }
          pthread_spin_lock(&handle->fhandle->lock);
          fVar2 = _fdb_close(handle);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            pthread_spin_unlock(&handle->fhandle->lock);
            return fVar2;
          }
          if (handle->kvs != (kvs_info *)0x0) {
            free(handle->kvs);
            handle->kvs = (kvs_info *)0x0;
          }
          list_remove(handle->fhandle->handles,&handle->node->le);
          pthread_spin_unlock(&handle->fhandle->lock);
          free(handle->node);
          fVar2 = FDB_RESULT_SUCCESS;
        }
        else {
          if (pkVar1->root == (fdb_kvs_handle *)0x0) {
            return FDB_RESULT_INVALID_ARGS;
          }
          fVar2 = _fdb_kvs_close(handle);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            return fVar2;
          }
          fVar2 = FDB_RESULT_SUCCESS;
          if (handle->kvs != (kvs_info *)0x0) {
            free(handle->kvs);
            handle->kvs = (kvs_info *)0x0;
          }
        }
      }
      else {
        fVar2 = _fdb_close(handle);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          return fVar2;
        }
      }
      free(handle);
    }
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_kvs_close(fdb_kvs_handle *handle)
{
    fdb_status fs;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }
    if (handle->num_iterators) {
        // There are still active iterators created from this handle
        return FDB_RESULT_KV_STORE_BUSY;
    }

    if (handle->shandle && handle->kvs == NULL) {
        // snapshot of the default KV store + single KV store mode
        // directly close handle
        // (snapshot of the other KV stores will be closed
        //  using _fdb_kvs_close(...) below)
        fs = _fdb_close(handle);
        if (fs == FDB_RESULT_SUCCESS) {
            free(handle);
        }
        return fs;
    }

    if (handle->kvs == NULL ||
        handle->kvs->type == KVS_ROOT) {
        // the default KV store handle

        fdb_assert(handle->fhandle->root != handle, handle, NULL);
        // the default KV store but not the root handle .. normally close
        spin_lock(&handle->fhandle->lock);
        fs = _fdb_close(handle);
        if (fs == FDB_RESULT_SUCCESS) {
            // remove from 'handles' list in the root node
            if (handle->kvs) {
                fdb_kvs_info_free(handle);
            }
            list_remove(handle->fhandle->handles, &handle->node->le);
            spin_unlock(&handle->fhandle->lock);
            free(handle->node);
            free(handle);
        } else {
            spin_unlock(&handle->fhandle->lock);
        }
        return fs;
    }

    if (handle->kvs && handle->kvs->root == NULL) {
        return FDB_RESULT_INVALID_ARGS;
    }
    fs = _fdb_kvs_close(handle);
    if (fs == FDB_RESULT_SUCCESS) {
        fdb_kvs_info_free(handle);
        free(handle);
    }
    return fs;
}